

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QString> * __thiscall
QList<QString>::mid(QList<QString> *__return_storage_ptr__,QList<QString> *this,qsizetype pos,
                   qsizetype len)

{
  QString *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  CutResult CVar4;
  QString *data;
  QString *pQVar5;
  long in_FS_OFFSET;
  qsizetype l;
  qsizetype p;
  QArrayData *d;
  QArrayDataPointer<QString> local_70;
  QArrayDataPointer<QString> local_58;
  longlong local_38;
  qsizetype local_30;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = len;
  local_30 = pos;
  CVar4 = QtPrivate::QContainerImplHelper::mid((this->d).size,&local_30,&local_38);
  if (CVar4 < Full) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (CVar4 == Full) {
    pDVar2 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_70.ptr = (QString *)QArrayData::allocate(&local_28,0x18,0x10,local_38,KeepSize);
    local_58.size = 0;
    if (0 < local_38) {
      pQVar5 = (this->d).ptr + local_30;
      pQVar1 = pQVar5 + local_38;
      do {
        pDVar3 = (pQVar5->d).d;
        local_70.ptr[local_58.size].d.d = pDVar3;
        local_70.ptr[local_58.size].d.ptr = (pQVar5->d).ptr;
        local_70.ptr[local_58.size].d.size = (pQVar5->d).size;
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pQVar5 = pQVar5 + 1;
        local_58.size = local_58.size + 1;
      } while (pQVar5 < pQVar1);
    }
    local_70.size = local_58.size;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    local_70.d = (Data *)local_28;
    local_58.size = 0;
    (__return_storage_ptr__->d).d = (Data *)local_28;
    (__return_storage_ptr__->d).ptr = local_70.ptr;
    (__return_storage_ptr__->d).size = local_70.size;
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}